

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void get_range(int ndim,int *dims,int *lo,int *hi)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  uVar7 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    iVar4 = rand();
    iVar1 = dims[uVar8];
    iVar5 = rand();
    iVar2 = dims[uVar8];
    piVar6 = lo;
    piVar3 = hi;
    if (iVar4 % iVar1 < iVar5 % iVar2) {
      piVar6 = hi;
      piVar3 = lo;
    }
    piVar3[uVar8] = iVar4 % iVar1;
    piVar6[uVar8] = iVar5 % iVar2;
  }
  return;
}

Assistant:

void get_range( int ndim, int dims[], int lo[], int hi[]) 
{
    int dim;
    for(dim=0; dim <ndim;dim++){
        int toss1, toss2;
        toss1 = rand()%dims[dim];
        toss2 = rand()%dims[dim];
        if(toss1<toss2){
            lo[dim]=toss1;
            hi[dim]=toss2;
        }else {
              hi[dim]=toss1;
            lo[dim]=toss2;
        }
    }
}